

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::initReferenceValues
          (TessellationShaderTessellationMaxInOut *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GLfloat *pGVar6;
  ResourceError *this_00;
  uint uVar7;
  GLfloat *pGVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  GLfloat sumInTCS [4];
  GLfloat sumInTES [4];
  string local_68;
  float local_48 [6];
  
  iVar1 = this->m_gl_max_tess_control_input_components_value;
  iVar2 = this->m_gl_max_tess_control_output_components_value;
  iVar3 = this->m_gl_max_tess_evaluation_input_components_value;
  iVar4 = this->m_gl_max_tess_evaluation_output_components_value;
  iVar5 = iVar4;
  if (iVar4 < iVar3) {
    iVar5 = iVar3;
  }
  if (iVar5 < iVar2) {
    iVar5 = iVar2;
  }
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  pGVar6 = (GLfloat *)malloc((long)iVar5 << 2);
  this->m_ref_vertex_attributes = pGVar6;
  if (pGVar6 == (GLfloat *)0x0) {
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unable to allocate memory!","");
    tcu::ResourceError::ResourceError(this_00,&local_68);
    __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  uVar12 = iVar1 - 4;
  if (0 < (int)uVar12) {
    uVar9 = 0;
    do {
      pGVar6[uVar9] = (float)(int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  if (0 < (int)uVar12) {
    uVar9 = 0;
    do {
      uVar11 = (ulong)((uint)uVar9 & 3);
      *(float *)((long)&local_68._M_dataplus._M_p + uVar11 * 4) =
           pGVar6[uVar9] + *(float *)((long)&local_68._M_dataplus._M_p + uVar11 * 4);
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  uVar10 = iVar2 - 4;
  if (0 < (int)uVar10) {
    uVar9 = 0;
    do {
      pGVar6[uVar9] =
           (float)(int)(uint)uVar9 +
           *(float *)((long)&local_68._M_dataplus._M_p + (ulong)((uint)uVar9 & 3) * 4);
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  if ((int)uVar12 < (int)uVar10) {
    pGVar8 = pGVar6 + (int)uVar12;
    do {
      *pGVar8 = (float)(int)uVar12;
      pGVar8 = pGVar8 + 1;
      iVar1 = uVar12 - iVar2;
      uVar12 = uVar12 + 1;
    } while (iVar1 != -5);
  }
  uVar12 = iVar3 - 4;
  if (0 < (int)uVar12) {
    uVar9 = 0;
    do {
      uVar10 = (uint)uVar9 & 3;
      local_48[uVar10] = pGVar6[uVar9] + local_48[uVar10];
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  uVar10 = iVar4 - 4;
  if (0 < (int)uVar10) {
    uVar9 = 0;
    do {
      pGVar6[uVar9] = (float)(int)(uint)uVar9 + local_48[(uint)uVar9 & 3];
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  if ((int)uVar12 < (int)uVar10) {
    pGVar8 = pGVar6 + (int)uVar12;
    do {
      *pGVar8 = (float)(int)uVar12;
      pGVar8 = pGVar8 + 1;
      iVar1 = uVar12 - iVar4;
      uVar12 = uVar12 + 1;
    } while (iVar1 != -5);
  }
  uVar7 = 0;
  pGVar6[(int)uVar10] = 0.0;
  pGVar6[iVar4 + -3] = 0.0;
  pGVar6[iVar4 + -2] = 0.0;
  pGVar6[iVar4 + -1] = 1.0;
  this->m_ref_patch_attributes[0] = 0.0;
  this->m_ref_patch_attributes[1] = 0.0;
  this->m_ref_patch_attributes[2] = 0.0;
  this->m_ref_patch_attributes[3] = 0.0;
  uVar12 = this->m_gl_max_tess_patch_components_value;
  if (0 < (int)uVar12) {
    do {
      this->m_ref_patch_attributes[uVar7 & 3] =
           (float)(int)uVar7 + this->m_ref_patch_attributes[uVar7 & 3];
      uVar7 = uVar7 + 1;
    } while (uVar12 != uVar7);
  }
  return;
}

Assistant:

void TessellationShaderTessellationMaxInOut::initReferenceValues(void)
{
	/* Allocate vertex attribute array data needed for reference values preparation. */
	int max_array_size = de::max(m_gl_max_tess_control_input_components_value,
								 de::max(m_gl_max_tess_control_output_components_value,
										 de::max(m_gl_max_tess_evaluation_input_components_value,
												 m_gl_max_tess_evaluation_output_components_value)));

	m_ref_vertex_attributes = (glw::GLfloat*)malloc(sizeof(glw::GLfloat) * (max_array_size));
	if (m_ref_vertex_attributes == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	/* We need to create an array consisting of gl_max_tess_evaluation_output_components items.
	 * The array will be filled with the following values:
	 *
	 * reference_value[0],
	 * (...)
	 * reference_value[gl_max_tess_evaluation_output_components / 4 - 2],
	 * reference_gl_Position
	 *
	 * which corresponds to output block defined for Tessellation Evaluation Stage:
	 *
	 * out Vertex
	 * {
	 *     vec4 value[(gl_MaxTessControlInputComponents) / 4 - 1];
	 * } outVertex;
	 *
	 * + gl_Position.
	 */
	glw::GLfloat sumInTCS[] = { 0.0f, 0.0f, 0.0f, 0.0f };
	glw::GLfloat sumInTES[] = { 0.0f, 0.0f, 0.0f, 0.0f };

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTCS[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_control_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTCS[i % 4] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_control_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTES[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTES[i % 4 /* component selector */] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_evaluation_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	/* Store gl_Position reference values (only first vertex will be compared) */
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 4] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 3] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 2] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 1] = 1.0f;

	/* Set up reference data for case 2
	 *
	 * Only one output vector will be needed for comparison.
	 */
	m_ref_patch_attributes[0] = 0.0f;
	m_ref_patch_attributes[1] = 0.0f;
	m_ref_patch_attributes[2] = 0.0f;
	m_ref_patch_attributes[3] = 0.0f;

	for (int i = 0; i < m_gl_max_tess_patch_components_value; i++)
	{
		m_ref_patch_attributes[i % 4] += (glw::GLfloat)i;
	}
}